

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

void initNodes(tree_t *tree)

{
  uint uVar1;
  bitset_word_t bVar2;
  long in_RDI;
  uint i;
  uint num_nodes_twice_word_boundary;
  uint node;
  uint num_nodes_twice;
  tree_t *in_stack_ffffffffffffffd8;
  uint local_18;
  uint local_10;
  
  if (*(int *)(in_RDI + 0x1c) == 0x10) {
    **(undefined8 **)(in_RDI + 8) = 0x1555555555555555;
  }
  else {
    uVar1 = *(int *)(in_RDI + 0x18) << 1;
    for (local_10 = (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x1c)) * 2;
        local_10 < uVar1 && (local_10 & 0x3f) != 0; local_10 = local_10 + 2) {
      set_bit(*(bitset_word_t **)(in_RDI + 8),(ulong)local_10);
    }
    for (; local_10 < (uVar1 & 0xffffffc0); local_10 = local_10 + 0x40) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + (ulong)(local_10 >> 6) * 8) = 0x5555555555555555;
    }
    for (; local_10 < uVar1; local_10 = local_10 + 2) {
      set_bit(*(bitset_word_t **)(in_RDI + 8),(ulong)local_10);
    }
    for (local_18 = (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x1c)) * 2; local_18 != 0;
        local_18 = local_18 - 2) {
      bVar2 = exists(in_stack_ffffffffffffffd8,0);
      if ((bVar2 != 0) || (bVar2 = exists(in_stack_ffffffffffffffd8,0), bVar2 != 0)) {
        set_bit(*(bitset_word_t **)(in_RDI + 8),(ulong)local_18);
      }
    }
    set_bit(*(bitset_word_t **)(in_RDI + 8),0);
  }
  return;
}

Assistant:

static void initNodes(tree_t* tree) {
#if BITSET_WORD_MAX == UINT64_MAX
  if (tree->numLeaves == 16) {
    tree->haveNodeExists[0] = BITSET_WORD_C(0x1555555555555555);
    return;
  }
#elif BITSET_WORD_MAX == UINT32_MAX
  if (tree->numLeaves == 16) {
    tree->haveNodeExists[0] = BITSET_WORD_C(0x55555555);
    tree->haveNodeExists[1] = BITSET_WORD_C(0x15555555);
    return;
  }
#endif

  const unsigned int num_nodes_twice = 2 * tree->numNodes;
  unsigned int node                  = 2 * (tree->numNodes - tree->numLeaves);
#if BITSET_WORD_MAX == UINT64_MAX || BITSET_WORD_MAX == UINT32_MAX
  /* Set leaves up to bitset_word_t boundary */
  for (; node < num_nodes_twice && node % (sizeof(bitset_word_t) * 8); node += 2) {
    set_bit(tree->haveNodeExists, node);
  }
  /* Set leaves taking a full bitset_word_t */
  const unsigned int num_nodes_twice_word_boundary =
      (num_nodes_twice / (sizeof(bitset_word_t) * 8)) * sizeof(bitset_word_t) * 8;
  for (; node < num_nodes_twice_word_boundary; node += sizeof(bitset_word_t) * 8) {
#if BITSET_WORD_MAX == UINT64_MAX
    tree->haveNodeExists[node / (sizeof(bitset_word_t) * 8)] = BITSET_WORD_C(0x5555555555555555);
#elif BITSET_WORD_MAX == UINT32_MAX
    tree->haveNodeExists[node / (sizeof(bitset_word_t) * 8)] = BITSET_WORD_C(0x55555555);
#endif
  }
#endif
  /* Set remaining leaves */
  for (; node < num_nodes_twice; node += 2) {
    set_bit(tree->haveNodeExists, node);
  }

  /* Build tree */
  for (unsigned int i = 2 * (tree->numNodes - tree->numLeaves); i > 0; i -= 2) {
    if (exists(tree, i + 1) || exists(tree, i + 2)) {
      set_bit(tree->haveNodeExists, i);
    }
  }
  set_bit(tree->haveNodeExists, 0);
}